

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-read-partial-array.h
# Opt level: O1

int read_partial_array(coda_cursor_conflict *cursor,long offset,long length,void *dst)

{
  long lVar1;
  ushort *puVar2;
  undefined1 uVar3;
  coda_type_class cVar4;
  coda_backend cVar5;
  coda_dynamic_type_struct *pcVar6;
  long lVar7;
  bool bVar8;
  int iVar9;
  coda_dynamic_type_struct *pcVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  size_t __n;
  
  pcVar6 = cursor->stack[(long)cursor->n + -1].type;
  if (pcVar6[1].backend != 2) {
    __assert_fail("variable->tag == tag_cdf_variable",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-cursor.c"
                  ,0x128,"int read_partial_array(const coda_cursor *, long, long, void *)");
  }
  lVar14 = (long)*(int *)((long)&pcVar6[2].definition + 4);
  pcVar10 = *(coda_dynamic_type_struct **)(pcVar6 + 2);
  if (*(coda_dynamic_type_struct **)(pcVar6 + 2) == (coda_dynamic_type_struct *)0x0) {
    pcVar10 = pcVar6;
  }
  cVar4 = pcVar10->definition->type_class;
  lVar1 = length + offset;
  iVar12 = (int)(offset / lVar14);
  iVar9 = (int)(lVar1 / lVar14);
  if (iVar12 <= iVar9) {
    cVar5 = pcVar6[3].backend;
    lVar15 = (long)iVar12;
    iVar12 = (iVar9 - iVar12) + 1;
    lVar16 = 0;
    do {
      lVar7 = *(long *)(*(long *)(pcVar6 + 4) + lVar15 * 8);
      if (lVar7 < 0) {
        bVar8 = false;
        coda_set_error(-200,"Missing record not supported for CDF variable");
      }
      else {
        lVar11 = (long)*(int *)((long)&pcVar6[2].definition + 4);
        __n = (int)cVar5 * lVar14;
        if (lVar1 < (lVar15 + 1) * lVar11) {
          __n = (long)(int)pcVar6[3].backend * (lVar1 - lVar15 * lVar11);
        }
        lVar13 = offset - lVar11 * lVar15;
        if (lVar13 == 0 || offset < lVar11 * lVar15) {
          lVar13 = 0;
        }
        else {
          lVar13 = lVar13 * (int)pcVar6[3].backend;
          __n = __n - lVar13;
        }
        if (pcVar6[4].definition == (coda_type *)0x0) {
          iVar9 = read_bytes((coda_product *)cursor->product[1].filename,lVar13 + lVar7,__n,
                             (void *)((long)dst + lVar16));
          if (iVar9 != 0) {
            bVar8 = false;
            goto LAB_00156819;
          }
        }
        else {
          memcpy((void *)((long)dst + lVar16),
                 (void *)((long)&(pcVar6[4].definition)->format + lVar13 + lVar7),__n);
        }
        lVar16 = lVar16 + __n;
        bVar8 = true;
      }
LAB_00156819:
      if (!bVar8) {
        return -1;
      }
      lVar15 = lVar15 + 1;
      iVar12 = iVar12 + -1;
    } while (iVar12 != 0);
  }
  if ((cVar4 != coda_text_class) && (*(int *)&cursor->product[1].field_0x14 != 1)) {
    switch(pcVar6[3].backend) {
    case coda_backend_binary:
      break;
    case 2:
      if (0 < length) {
        lVar14 = 0;
        do {
          puVar2 = (ushort *)((long)dst + lVar14 * 2);
          *puVar2 = *puVar2 << 8 | *puVar2 >> 8;
          lVar14 = lVar14 + 1;
        } while (length != lVar14);
      }
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-cursor.c"
                    ,0x17b,"int read_partial_array(const coda_cursor *, long, long, void *)");
    case 4:
      if (0 < length) {
        lVar14 = 0;
        do {
          uVar3 = *(undefined1 *)((long)dst + lVar14 * 4 + 3);
          *(undefined1 *)((long)dst + lVar14 * 4 + 3) = *(undefined1 *)((long)dst + lVar14 * 4);
          *(undefined1 *)((long)dst + lVar14 * 4) = uVar3;
          puVar2 = (ushort *)((long)dst + lVar14 * 4 + 1);
          *puVar2 = *puVar2 << 8 | *puVar2 >> 8;
          lVar14 = lVar14 + 1;
        } while (length != lVar14);
      }
      break;
    case 8:
      if (0 < length) {
        do {
          swap8(dst);
          dst = (void *)((long)dst + 8);
          length = length + -1;
        } while (length != 0);
      }
    }
  }
  return 0;
}

Assistant:

static int read_partial_array(const coda_cursor *cursor, read_function read_basic_type_function, long offset,
                              long length, uint8_t *dst, int basic_type_size)
{
    coda_cursor array_cursor;
    int i;

    array_cursor = *cursor;

    if (length > 0)
    {
        if (coda_cursor_goto_array_element_by_index(&array_cursor, offset) != 0)
        {
            return -1;
        }
        for (i = 0; i < length; i++)
        {
            if ((*read_basic_type_function)(&array_cursor, &dst[i * basic_type_size]) != 0)
            {
                return -1;
            }
            if (i < length - 1)
            {
                if (coda_cursor_goto_next_array_element(&array_cursor) != 0)
                {
                    return -1;
                }
            }
        }
    }

    return 0;
}